

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O0

UScriptCode uscript_getScript_63(UChar32 c,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UScriptCode UVar2;
  uint32_t scriptX;
  UErrorCode *pErrorCode_local;
  UChar32 c_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    pErrorCode_local._4_4_ = USCRIPT_INVALID_CODE;
  }
  else if ((uint)c < 0x110000) {
    UVar2 = u_getUnicodeProperties_63(c,0);
    pErrorCode_local._4_4_ = UVar2 & 0xc000ff;
    if (0x3fffff < (uint)pErrorCode_local._4_4_) {
      if ((uint)pErrorCode_local._4_4_ < 0x800000) {
        pErrorCode_local._4_4_ = USCRIPT_COMMON;
      }
      else if ((uint)pErrorCode_local._4_4_ < 0xc00000) {
        pErrorCode_local._4_4_ = USCRIPT_INHERITED;
      }
      else {
        pErrorCode_local._4_4_ =
             (UScriptCode)
             scriptExtensions[(uint)(UVar2 & (USCRIPT_MATHEMATICAL_NOTATION|USCRIPT_TAI_VIET))];
      }
    }
  }
  else {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    pErrorCode_local._4_4_ = USCRIPT_INVALID_CODE;
  }
  return pErrorCode_local._4_4_;
}

Assistant:

U_CAPI UScriptCode U_EXPORT2
uscript_getScript(UChar32 c, UErrorCode *pErrorCode) {
    uint32_t scriptX;
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return USCRIPT_INVALID_CODE;
    }
    if((uint32_t)c>0x10ffff) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return USCRIPT_INVALID_CODE;
    }
    scriptX=u_getUnicodeProperties(c, 0)&UPROPS_SCRIPT_X_MASK;
    if(scriptX<UPROPS_SCRIPT_X_WITH_COMMON) {
        return (UScriptCode)scriptX;
    } else if(scriptX<UPROPS_SCRIPT_X_WITH_INHERITED) {
        return USCRIPT_COMMON;
    } else if(scriptX<UPROPS_SCRIPT_X_WITH_OTHER) {
        return USCRIPT_INHERITED;
    } else {
        return (UScriptCode)scriptExtensions[scriptX&UPROPS_SCRIPT_MASK];
    }
}